

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O3

bool tinyusdz::srgb_8bit_to_linear_8bit
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_img,size_t width,
               size_t height,size_t channels,size_t channel_stride,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *out_img,string *err)

{
  bool bVar1;
  ulong uVar2;
  ostringstream oVar3;
  int iVar4;
  ostream *poVar5;
  pointer puVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  size_t u;
  long lVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  size_t dest_size;
  uint8_t linearlization_table [256];
  string local_210;
  size_t local_1f0;
  undefined1 local_1e8 [8];
  undefined8 *local_1e0;
  undefined8 local_1d0 [2];
  undefined1 local_1c0 [24];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0._0_8_ = channel_stride;
  local_1c0._8_8_ = channels;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x214);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar10 = "width is zero.";
    lVar14 = 0xe;
LAB_0044c44c:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_0044c4a8;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_0044c4a8;
  }
  else {
    local_1f0 = height;
    if (height == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x218);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar10 = "height is zero.";
      lVar14 = 0xf;
      goto LAB_0044c44c;
    }
    if (channels == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x21c);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar10 = "channels is zero.";
      lVar14 = 0x11;
      goto LAB_0044c44c;
    }
    if (out_img == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x220);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar10 = "`out_img` is nullptr.";
      lVar14 = 0x15;
      goto LAB_0044c44c;
    }
    sVar8 = channels;
    if ((channel_stride == 0) || (sVar8 = channel_stride, channels <= channel_stride)) {
      local_1e8 = (undefined1  [8])(height * width * sVar8);
      puVar6 = (in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
      bVar15 = (long)local_1e8 - (long)puVar6 == 0;
      bVar1 = (ulong)local_1e8 < puVar6 || bVar15;
      if ((ulong)local_1e8 < puVar6 || bVar15) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_img,
                   (size_type)local_1e8);
        lVar14 = 0;
        do {
          fVar16 = (float)lVar14 / 255.0;
          fVar17 = 0.0;
          if ((0.0 < fVar16) && (fVar17 = 1.0, fVar16 < 1.0)) {
            if (0.04045 <= fVar16) {
              fVar17 = powf((fVar16 + 0.055) / 1.055,2.4);
            }
            else {
              fVar17 = fVar16 / 12.92;
            }
          }
          iVar4 = (int)(fVar17 * 255.0);
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          oVar3 = SUB41(iVar4,0);
          if (iVar4 < 1) {
            oVar3 = (ostringstream)0x0;
          }
          local_1a8[lVar14] = oVar3;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x100);
        lVar14 = 0;
        sVar7 = 0;
        sVar12 = channels;
        do {
          sVar11 = 0;
          lVar9 = lVar14;
          do {
            if (sVar12 == 0) {
              uVar2 = 0;
              sVar12 = 0;
            }
            else {
              uVar13 = 0;
              do {
                *(ostringstream *)
                 ((out_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar13 + lVar9) =
                     local_1a8[(in_img->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar13 + lVar9]];
                uVar13 = uVar13 + 1;
                uVar2 = channels;
                sVar12 = channels;
              } while (uVar13 < channels);
            }
            for (; uVar2 < sVar8; uVar2 = uVar2 + 1) {
              (out_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar2 + lVar9] =
                   (in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar2 + lVar9];
            }
            sVar11 = sVar11 + 1;
            lVar9 = lVar9 + sVar8;
          } while (sVar11 != width);
          sVar7 = sVar7 + 1;
          lVar14 = lVar14 + sVar8 * width;
        } while (sVar7 != local_1f0);
        return bVar1;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x22d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1e0 = local_1d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,
                 "Insufficient input buffer size. must be the same or larger than {} but has {}","")
      ;
      local_1c0._16_8_ =
           (long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      fmt::format<unsigned_long,unsigned_long>
                (&local_210,(fmt *)&local_1e0,(string *)local_1e8,
                 (unsigned_long *)(local_1c0 + 0x10),(unsigned_long *)channel_stride);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return bVar1;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x227);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    local_1e0 = local_1d0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"channel_stride {} is smaller than input channels {}","");
    fmt::format<unsigned_long,unsigned_long>
              (&local_210,(fmt *)&local_1e0,(string *)local_1c0,(unsigned_long *)(local_1c0 + 8),
               (unsigned_long *)channel_stride);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    if (err == (string *)0x0) goto LAB_0044c4a8;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_0044c4a8;
  }
  operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
LAB_0044c4a8:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return false;
}

Assistant:

bool srgb_8bit_to_linear_8bit(const std::vector<uint8_t> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<uint8_t> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // TODO: Precompute table.
  uint8_t linearlization_table[256];
  for (size_t u = 0; u < 256; u++) {
    float f = float(u) / 255.0f;
    linearlization_table[u] = detail::f32_to_u8(SrgbTransform::srgbToLinear(f));
  }

  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = linearlization_table[in_img[idx]];
      }

      // remainder(usually alpha channel)
      // no op.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = in_img[idx];
      }
    }
  }

  return true;
}